

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdTable.cpp
# Opt level: O0

void __thiscall IdTable::IdTable(IdTable *this)

{
  value_type local_20 [4];
  IdTable *local_10;
  IdTable *this_local;
  
  local_10 = this;
  std::vector<Id_*,_std::allocator<Id_*>_>::vector(&this->table);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->index);
  local_20[0] = 0;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->index,local_20);
  return;
}

Assistant:

IdTable::IdTable(){
  index.push(0);
}